

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# endpoint.hpp
# Opt level: O3

connection_ptr __thiscall
websocketpp::endpoint<websocketpp::connection<websocketpp::config::asio>,_websocketpp::config::asio>
::get_con_from_hdl(endpoint<websocketpp::connection<websocketpp::config::asio>,_websocketpp::config::asio>
                   *this,connection_hdl *hdl,error_code *ec)

{
  int iVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  _Atomic_word _Var2;
  undefined4 *in_RCX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  long lVar3;
  bool bVar4;
  connection_ptr cVar5;
  
  this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)ec->_M_cat;
  if (this_00 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
LAB_0018446b:
    *(undefined8 *)
     &(this->super_transport_type).super_socket_type.m_socket_init_handler.super__Function_base.
      _M_functor = 0;
    *(undefined8 *)
     ((long)&(this->super_transport_type).super_socket_type.m_socket_init_handler.
             super__Function_base._M_functor + 8) = 0;
  }
  else {
    _Var2 = this_00->_M_use_count;
    do {
      if (_Var2 == 0) goto LAB_0018446b;
      LOCK();
      iVar1 = this_00->_M_use_count;
      bVar4 = _Var2 == iVar1;
      if (bVar4) {
        this_00->_M_use_count = _Var2 + 1;
        iVar1 = _Var2;
      }
      _Var2 = iVar1;
      UNLOCK();
    } while (!bVar4);
    iVar1 = this_00->_M_use_count;
    if (iVar1 == 0) {
      lVar3 = 0;
    }
    else {
      lVar3 = *(long *)ec;
    }
    *(long *)&(this->super_transport_type).super_socket_type.m_socket_init_handler.
              super__Function_base._M_functor = lVar3;
    *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
     ((long)&(this->super_transport_type).super_socket_type.m_socket_init_handler.
             super__Function_base._M_functor + 8) = this_00;
    if (__libc_single_threaded == '\0') {
      LOCK();
      this_00->_M_use_count = this_00->_M_use_count + 1;
      UNLOCK();
      lVar3 = *(long *)&(this->super_transport_type).super_socket_type.m_socket_init_handler.
                        super__Function_base._M_functor;
    }
    else {
      this_00->_M_use_count = iVar1 + 1;
    }
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
    ec = (error_code *)extraout_RDX;
    if (lVar3 != 0) goto LAB_0018448f;
  }
  if (error::get_category()::instance == '\0') {
    endpoint<websocketpp::connection<websocketpp::config::asio>,websocketpp::config::asio>::
    get_con_from_hdl();
    ec = (error_code *)extraout_RDX_00;
  }
  *in_RCX = 0xf;
  *(undefined8 **)(in_RCX + 2) = &error::get_category()::instance;
LAB_0018448f:
  cVar5.
  super___shared_ptr<websocketpp::connection<websocketpp::config::asio>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)ec;
  cVar5.
  super___shared_ptr<websocketpp::connection<websocketpp::config::asio>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)this;
  return (connection_ptr)
         cVar5.
         super___shared_ptr<websocketpp::connection<websocketpp::config::asio>,_(__gnu_cxx::_Lock_policy)2>
  ;
}

Assistant:

connection_ptr get_con_from_hdl(connection_hdl hdl, lib::error_code & ec) {
        connection_ptr con = lib::static_pointer_cast<connection_type>(
            hdl.lock());
        if (!con) {
            ec = error::make_error_code(error::bad_connection);
        }
        return con;
    }